

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode redirect_url(char *base,char *relurl,CURLU *u,uint flags)

{
  char cVar1;
  CURLcode CVar2;
  CURLUcode CVar3;
  CURLUcode CVar4;
  size_t sVar5;
  char *pcVar6;
  void *pvVar7;
  _Bool relative;
  int iVar8;
  char *pcVar9;
  dynbuf urlbuf;
  dynbuf local_50;
  
  sVar5 = strlen(u->scheme);
  if (base == (char *)0x0) {
    return CURLUE_MALFORMED_INPUT;
  }
  pcVar9 = base + sVar5 + 3;
  cVar1 = *relurl;
  if (cVar1 == '#') {
    iVar8 = 0x23;
    if (u->fragment != (char *)0x0) {
LAB_0016641f:
      pcVar6 = strchr(pcVar9,iVar8);
LAB_00166460:
      relative = true;
      if (pcVar6 != (char *)0x0) goto LAB_0016649b;
    }
LAB_001664a0:
    sVar5 = strlen(base);
    relative = true;
  }
  else {
    if (cVar1 == '/') {
      iVar8 = 0x2f;
      if (relurl[1] != '/') goto LAB_0016641f;
      relurl = relurl + 2;
      relative = false;
      pcVar6 = pcVar9;
    }
    else {
      if (((u->query == (char *)0x0) || (iVar8 = 0x3f, *u->query == '\0')) &&
         ((u->fragment == (char *)0x0 || (iVar8 = 0x23, *u->fragment == '\0')))) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = strchr(pcVar9,iVar8);
      }
      if (cVar1 == '?') goto LAB_00166460;
      if (pcVar6 == (char *)0x0) {
        sVar5 = strlen(pcVar9);
      }
      else {
        sVar5 = (long)pcVar6 - (long)pcVar9;
      }
      pvVar7 = memrchr(pcVar9,0x2f,sVar5);
      if (pvVar7 == (void *)0x0) goto LAB_001664a0;
      pcVar6 = (char *)((long)pvVar7 + 1);
      relative = true;
    }
LAB_0016649b:
    sVar5 = (long)pcVar6 - (long)base;
  }
  Curl_dyn_init(&local_50,8000000);
  CVar2 = Curl_dyn_addn(&local_50,base,sVar5);
  CVar4 = CURLUE_OUT_OF_MEMORY;
  if (CVar2 == CURLE_OK) {
    sVar5 = strlen(relurl);
    CVar3 = urlencode_str(&local_50,relurl,sVar5,relative,false);
    if (CVar3 == CURLUE_OK) {
      pcVar9 = Curl_dyn_ptr(&local_50);
      CVar4 = parseurl_and_replace(pcVar9,u,flags & 0xffffffef);
    }
  }
  Curl_dyn_free(&local_50);
  return CVar4;
}

Assistant:

static CURLUcode redirect_url(const char *base, const char *relurl,
                              CURLU *u, unsigned int flags)
{
  struct dynbuf urlbuf;
  bool host_changed = FALSE;
  const char *useurl = relurl;
  const char *cutoff = NULL;
  size_t prelen;
  CURLUcode uc;

  /* protsep points to the start of the hostname, after [scheme]:// */
  const char *protsep = base + strlen(u->scheme) + 3;
  DEBUGASSERT(base && relurl && u); /* all set here */
  if(!base)
    return CURLUE_MALFORMED_INPUT; /* should never happen */

  /* handle different relative URL types */
  switch(relurl[0]) {
  case '/':
    if(relurl[1] == '/') {
      /* protocol-relative URL: //example.com/path */
      cutoff = protsep;
      useurl = &relurl[2];
      host_changed = TRUE;
    }
    else
      /* absolute /path */
      cutoff = strchr(protsep, '/');
    break;

  case '#':
    /* fragment-only change */
    if(u->fragment)
      cutoff = strchr(protsep, '#');
    break;

  default:
    /* path or query-only change */
    if(u->query && u->query[0])
      /* remove existing query */
      cutoff = strchr(protsep, '?');
    else if(u->fragment && u->fragment[0])
      /* Remove existing fragment */
      cutoff = strchr(protsep, '#');

    if(relurl[0] != '?') {
      /* append a relative path after the last slash */
      cutoff = memrchr(protsep, '/',
                       cutoff ? (size_t)(cutoff - protsep) : strlen(protsep));
      if(cutoff)
        cutoff++; /* truncate after last slash */
    }
    break;
  }

  prelen = cutoff ? (size_t)(cutoff - base) : strlen(base);

  /* build new URL */
  Curl_dyn_init(&urlbuf, CURL_MAX_INPUT_LENGTH);

  if(!Curl_dyn_addn(&urlbuf, base, prelen) &&
     !urlencode_str(&urlbuf, useurl, strlen(useurl), !host_changed, FALSE)) {
    uc = parseurl_and_replace(Curl_dyn_ptr(&urlbuf), u,
                              flags & ~CURLU_PATH_AS_IS);
  }
  else
    uc = CURLUE_OUT_OF_MEMORY;

  Curl_dyn_free(&urlbuf);
  return uc;
}